

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O1

uint RDL_bitset_init(uchar **compressed,uint size)

{
  uchar *__s;
  uint uVar1;
  
  uVar1 = ((size >> 3) + 1) - (uint)((size & 7) == 0);
  __s = (uchar *)malloc((ulong)uVar1);
  *compressed = __s;
  memset(__s,0,(ulong)uVar1);
  return uVar1;
}

Assistant:

unsigned RDL_bitset_init(unsigned char** compressed, unsigned size)
{
  unsigned new_size;

  new_size = size / BlockSize;
  if (size % BlockSize) {
    ++new_size;
  }

  *compressed = malloc(new_size * sizeof(**compressed));
  memset(*compressed, 0, new_size * sizeof(**compressed));

  return new_size;
}